

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb::ArrowArrayStreamWrapper::GetSchema(ArrowArrayStreamWrapper *this,ArrowSchemaWrapper *schema)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  string *msg;
  long in_RSI;
  long in_RDI;
  string *in_stack_fffffffffffffef8;
  InvalidInputException *in_stack_ffffffffffffff00;
  allocator *this_00;
  allocator local_b9;
  string local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  allocator in_stack_ffffffffffffff6f;
  InvalidInputException *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  iVar1 = (**(code **)(in_RDI + 8))(in_RDI + 8,in_RSI);
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"arrow_scan: get_schema failed(): %s",&local_31);
    pcVar3 = GetError((ArrowArrayStreamWrapper *)0x15289cd);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,pcVar3,&local_69);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (in_stack_ffffffffffffff70,
               (string *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
               in_stack_ffffffffffffff60);
    __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  if (*(long *)(local_10 + 0x38) == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"arrow_scan: released schema passed",
               (allocator *)&stack0xffffffffffffff6f);
    InvalidInputException::InvalidInputException
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  if (*(long *)(local_10 + 0x20) < 1) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_b9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"arrow_scan: empty schema passed",this_00);
    InvalidInputException::InvalidInputException((InvalidInputException *)this_00,msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return;
}

Assistant:

void ArrowArrayStreamWrapper::GetSchema(ArrowSchemaWrapper &schema) {
	D_ASSERT(arrow_array_stream.get_schema);
	// LCOV_EXCL_START
	if (arrow_array_stream.get_schema(&arrow_array_stream, &schema.arrow_schema)) {
		throw InvalidInputException("arrow_scan: get_schema failed(): %s", string(GetError()));
	}
	if (!schema.arrow_schema.release) {
		throw InvalidInputException("arrow_scan: released schema passed");
	}
	if (schema.arrow_schema.n_children < 1) {
		throw InvalidInputException("arrow_scan: empty schema passed");
	}
	// LCOV_EXCL_STOP
}